

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O0

void printhead(fout f,rnndb *db)

{
  size_t sVar1;
  char *pcVar2;
  uint *in_RDI;
  char *in_stack_00000008;
  FILE *in_stack_00000010;
  uint len_1;
  uint len;
  uint maxlen;
  tm tm;
  stat sb;
  int j;
  int i;
  uint local_dc;
  tm local_d8 [2];
  time_t atStackY_48 [2];
  char *in_stack_ffffffffffffffc8;
  FILE *in_stack_ffffffffffffffd0;
  int local_10;
  int local_c;
  
  stat(in_stack_00000008,(stat *)(local_d8 + 1));
  gmtime_r(atStackY_48,local_d8);
  fprintf(in_stack_00000010,"#ifndef %s\n",_len);
  fprintf(in_stack_00000010,"#define %s\n",_len);
  fprintf(in_stack_00000010,"\n");
  fprintf(in_stack_00000010,
          "/* Autogenerated file, DO NOT EDIT manually!\n\nThis file was generated by the rules-ng-ng headergen tool in this git repository:\nhttp://0x04.net/cgit/index.cgi/rules-ng-ng\ngit clone git://0x04.net/rules-ng-ng\n\nThe rules-ng-ng source files this header was generated from are:\n"
         );
  local_dc = 0;
  for (local_c = 0; local_c < (int)in_RDI[0x1e]; local_c = local_c + 1) {
    sVar1 = strlen(*(char **)(*(long *)(in_RDI + 0x1c) + (long)local_c * 8));
    if (local_dc < (uint)sVar1) {
      local_dc = (uint)sVar1;
    }
  }
  for (local_c = 0; local_c < (int)in_RDI[0x1e]; local_c = local_c + 1) {
    sVar1 = strlen(*(char **)(*(long *)(in_RDI + 0x1c) + (long)local_c * 8));
    fprintf(in_stack_00000010,"- %s%*s ",
            *(undefined8 *)(*(long *)(in_RDI + 0x1c) + (long)local_c * 8),
            (ulong)(local_dc - (int)sVar1),"");
    print_file_info(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  fprintf(in_stack_00000010,"\nCopyright (C) ");
  if ((*in_RDI != 0) && (*in_RDI < local_d8[0].tm_year + 0x76cU)) {
    fprintf(in_stack_00000010,"%u-",(ulong)*in_RDI);
  }
  fprintf(in_stack_00000010,"%u",(ulong)(local_d8[0].tm_year + 0x76c));
  if (in_RDI[6] != 0) {
    fprintf(in_stack_00000010," by the following authors:");
    for (local_c = 0; local_c < (int)in_RDI[6]; local_c = local_c + 1) {
      fprintf(in_stack_00000010,"\n- ");
      if (**(long **)(*(long *)(in_RDI + 4) + (long)local_c * 8) != 0) {
        fprintf(in_stack_00000010,"%s",**(undefined8 **)(*(long *)(in_RDI + 4) + (long)local_c * 8))
        ;
      }
      if (*(long *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_c * 8) + 8) != 0) {
        fprintf(in_stack_00000010," <%s>",
                *(undefined8 *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_c * 8) + 8));
      }
      if (*(int *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_c * 8) + 0x28) != 0) {
        for (local_10 = 0;
            local_10 < *(int *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_c * 8) + 0x28);
            local_10 = local_10 + 1) {
          pcVar2 = " (";
          if (local_10 != 0) {
            pcVar2 = ", ";
          }
          fprintf(in_stack_00000010,"%s%s",pcVar2,
                  *(undefined8 *)
                   (*(long *)(*(long *)(*(long *)(in_RDI + 4) + (long)local_c * 8) + 0x20) +
                   (long)local_10 * 8));
        }
        fprintf(in_stack_00000010,")");
      }
    }
  }
  fprintf(in_stack_00000010,"\n");
  if (*(long *)(in_RDI + 2) != 0) {
    fprintf(in_stack_00000010,"\n%s\n",*(undefined8 *)(in_RDI + 2));
  }
  fprintf(in_stack_00000010,"*/\n\n\n");
  return;
}

Assistant:

void printhead(struct fout f, struct rnndb *db) {
	int i, j;
	struct stat sb;
	struct tm tm;
	stat(f.name, &sb);
	gmtime_r(&sb.st_mtime, &tm);
	fprintf (f.file, "#ifndef %s\n", f.guard);
	fprintf (f.file, "#define %s\n", f.guard);
	fprintf (f.file, "\n");
	fprintf(f.file,
		"/* Autogenerated file, DO NOT EDIT manually!\n"
		"\n"
		"This file was generated by the rules-ng-ng headergen tool in this git repository:\n"
		"http://0x04.net/cgit/index.cgi/rules-ng-ng\n"
		"git clone git://0x04.net/rules-ng-ng\n"
		"\n"
		"The rules-ng-ng source files this header was generated from are:\n");
	unsigned maxlen = 0;
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		if(len > maxlen)
			maxlen = len;
	}
	for(i = 0; i < db->filesnum; ++i) {
		unsigned len = strlen(db->files[i]);
		fprintf(f.file, "- %s%*s ", db->files[i], maxlen - len, "");
		print_file_info(f.file, db->files[i]);
	}
	fprintf(f.file,
		"\n"
		"Copyright (C) ");
	if(db->copyright.firstyear && db->copyright.firstyear < (1900 + tm.tm_year))
		fprintf(f.file, "%u-", db->copyright.firstyear);
	fprintf(f.file, "%u", 1900 + tm.tm_year);
	if(db->copyright.authorsnum) {
		fprintf(f.file, " by the following authors:");
		for(i = 0; i < db->copyright.authorsnum; ++i) {
			fprintf(f.file, "\n- ");
			if(db->copyright.authors[i]->name)
				fprintf(f.file, "%s", db->copyright.authors[i]->name);
			if(db->copyright.authors[i]->email)
				fprintf(f.file, " <%s>", db->copyright.authors[i]->email);
			if(db->copyright.authors[i]->nicknamesnum) {
				for(j = 0; j < db->copyright.authors[i]->nicknamesnum; ++j) {
					fprintf(f.file, "%s%s", (j ? ", " : " ("), db->copyright.authors[i]->nicknames[j]);
				}
				fprintf(f.file, ")");
			}
		}
	}
	fprintf(f.file, "\n");
	if(db->copyright.license)
		fprintf(f.file, "\n%s\n", db->copyright.license);
	fprintf(f.file, "*/\n\n\n");
}